

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batch_task_manager.hpp
# Opt level: O1

void __thiscall
duckdb::BatchTaskManager<duckdb::BatchCopyTask>::AddTask
          (BatchTaskManager<duckdb::BatchCopyTask> *this,
          unique_ptr<duckdb::BatchCopyTask,_std::default_delete<duckdb::BatchCopyTask>,_true> *task)

{
  iterator *piVar1;
  _Elt_pointer puVar2;
  int iVar3;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar3 == 0) {
    puVar2 = (this->task_queue).c.
             super__Deque_base<duckdb::unique_ptr<duckdb::BatchCopyTask,_std::default_delete<duckdb::BatchCopyTask>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BatchCopyTask,_std::default_delete<duckdb::BatchCopyTask>,_true>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (puVar2 == (this->task_queue).c.
                  super__Deque_base<duckdb::unique_ptr<duckdb::BatchCopyTask,_std::default_delete<duckdb::BatchCopyTask>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BatchCopyTask,_std::default_delete<duckdb::BatchCopyTask>,_true>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
      ::std::
      deque<duckdb::unique_ptr<duckdb::BatchCopyTask,std::default_delete<duckdb::BatchCopyTask>,true>,std::allocator<duckdb::unique_ptr<duckdb::BatchCopyTask,std::default_delete<duckdb::BatchCopyTask>,true>>>
      ::
      _M_push_back_aux<duckdb::unique_ptr<duckdb::BatchCopyTask,std::default_delete<duckdb::BatchCopyTask>,true>>
                ((deque<duckdb::unique_ptr<duckdb::BatchCopyTask,std::default_delete<duckdb::BatchCopyTask>,true>,std::allocator<duckdb::unique_ptr<duckdb::BatchCopyTask,std::default_delete<duckdb::BatchCopyTask>,true>>>
                  *)&this->task_queue,task);
    }
    else {
      (puVar2->super_unique_ptr<duckdb::BatchCopyTask,_std::default_delete<duckdb::BatchCopyTask>_>)
      ._M_t.
      super___uniq_ptr_impl<duckdb::BatchCopyTask,_std::default_delete<duckdb::BatchCopyTask>_>._M_t
      .super__Tuple_impl<0UL,_duckdb::BatchCopyTask_*,_std::default_delete<duckdb::BatchCopyTask>_>.
      super__Head_base<0UL,_duckdb::BatchCopyTask_*,_false>._M_head_impl =
           (task->
           super_unique_ptr<duckdb::BatchCopyTask,_std::default_delete<duckdb::BatchCopyTask>_>).
           _M_t.
           super___uniq_ptr_impl<duckdb::BatchCopyTask,_std::default_delete<duckdb::BatchCopyTask>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::BatchCopyTask_*,_std::default_delete<duckdb::BatchCopyTask>_>
           .super__Head_base<0UL,_duckdb::BatchCopyTask_*,_false>._M_head_impl;
      (task->super_unique_ptr<duckdb::BatchCopyTask,_std::default_delete<duckdb::BatchCopyTask>_>).
      _M_t.super___uniq_ptr_impl<duckdb::BatchCopyTask,_std::default_delete<duckdb::BatchCopyTask>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::BatchCopyTask_*,_std::default_delete<duckdb::BatchCopyTask>_>.
      super__Head_base<0UL,_duckdb::BatchCopyTask_*,_false>._M_head_impl = (BatchCopyTask *)0x0;
      piVar1 = &(this->task_queue).c.
                super__Deque_base<duckdb::unique_ptr<duckdb::BatchCopyTask,_std::default_delete<duckdb::BatchCopyTask>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BatchCopyTask,_std::default_delete<duckdb::BatchCopyTask>,_true>_>_>
                ._M_impl.super__Deque_impl_data._M_finish;
      piVar1->_M_cur = piVar1->_M_cur + 1;
    }
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return;
  }
  ::std::__throw_system_error(iVar3);
}

Assistant:

void AddTask(unique_ptr<TASK> task) {
		lock_guard<mutex> l(task_lock);
		task_queue.push(std::move(task));
	}